

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

statement_ptr __thiscall
mjs::parser::
make_statement<mjs::function_definition,mjs::source_extend&,std::__cxx11::wstring&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
          (parser *this,source_extend *args,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args_1,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *args_2,unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *args_3)

{
  position_stack_node *this_00;
  function_definition *this_01;
  statement_ptr *in_R9;
  source_extend local_48;
  
  this_00 = *(position_stack_node **)&args[4].start;
  if (this_00 != (position_stack_node *)0x0) {
    this_01 = (function_definition *)operator_new(0x80);
    position_stack_node::extend(&local_48,this_00);
    function_definition::function_definition
              (this_01,&local_48,(source_extend *)args_1,(wstring *)args_2,
               (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)args_3,in_R9);
    (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this_01;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)
           (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)this;
  }
  __assert_fail("statement_pos_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0x147,
                "statement_ptr mjs::parser::make_statement(Args &&...) [T = mjs::function_definition, Args = <mjs::source_extend &, std::basic_string<wchar_t> &, std::vector<std::basic_string<wchar_t>>, std::unique_ptr<mjs::statement>>]"
               );
}

Assistant:

statement_ptr make_statement(Args&&... args) {
        assert(statement_pos_);
        auto s = statement_ptr{new T{statement_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << s->extend() << " Producting: " << *s << "\n";
#endif
        return s;
    }